

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O3

void DecodeAperiodicity(double **coded_aperiodicity,int f0_length,int fs,int fft_size,
                       double **aperiodicity)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  double *pdVar4;
  double *x;
  double *y;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint xi_length;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  
  auVar17 = _DAT_0010c230;
  auVar2 = _DAT_0010c220;
  xi_length = fft_size / 2 + 1;
  if (0 < f0_length) {
    lVar6 = (ulong)xi_length - 1;
    auVar11._8_4_ = (int)lVar6;
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar11 = auVar11 ^ _DAT_0010c230;
    do {
      if (-2 < fft_size) {
        pdVar4 = aperiodicity[uVar5];
        uVar9 = 0;
        auVar15 = auVar2;
        do {
          auVar16 = auVar15 ^ auVar17;
          if ((bool)(~(auVar11._4_4_ < auVar16._4_4_ ||
                      auVar11._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar11._4_4_) & 1)) {
            pdVar4[uVar9] = 0.999999999999;
          }
          if (auVar16._12_4_ <= auVar11._12_4_ &&
              (auVar16._8_4_ <= auVar11._8_4_ || auVar16._12_4_ != auVar11._12_4_)) {
            pdVar4[uVar9 + 1] = 0.999999999999;
          }
          uVar9 = uVar9 + 2;
          lVar6 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar6 + 2;
        } while (((ulong)xi_length + 1 & 0x1fffffffe) != uVar9);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)f0_length);
  }
  dVar13 = (double)fs * 0.5;
  dVar10 = dVar13 + -3000.0;
  dVar18 = 15000.0;
  if (dVar10 <= 15000.0) {
    dVar18 = dVar10;
  }
  uVar3 = (uint)(dVar18 / 3000.0);
  uVar5 = (long)(int)xi_length << 3;
  if (fft_size < -3) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar5);
  auVar2 = _DAT_0010c230;
  uVar5 = (ulong)xi_length;
  if (-2 < fft_size) {
    dVar18 = (double)fs / (double)fft_size;
    lVar6 = uVar5 - 1;
    auVar16._8_4_ = (int)lVar6;
    auVar16._0_8_ = lVar6;
    auVar16._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar9 = 0;
    auVar16 = auVar16 ^ _DAT_0010c230;
    auVar17 = _DAT_0010c220;
    do {
      auVar11 = auVar17 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar11._0_4_ ||
                  auVar16._4_4_ < auVar11._4_4_) & 1)) {
        pdVar4[uVar9] = (double)(int)uVar9 * dVar18;
      }
      if ((auVar11._12_4_ != auVar16._12_4_ || auVar11._8_4_ <= auVar16._8_4_) &&
          auVar11._12_4_ <= auVar16._12_4_) {
        pdVar4[uVar9 + 1] = (double)((int)uVar9 + 1) * dVar18;
      }
      uVar9 = uVar9 + 2;
      lVar6 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar6 + 2;
    } while ((uVar5 + 1 & 0x1fffffffe) != uVar9);
  }
  uVar9 = (long)(int)uVar3 * 8 + 0x10;
  if ((int)uVar3 < -2) {
    uVar9 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar9);
  auVar2 = _DAT_0010c230;
  uVar8 = uVar3 + 1;
  if (-1 < (int)uVar3) {
    lVar6 = (ulong)uVar8 - 1;
    auVar12._8_4_ = (int)lVar6;
    auVar12._0_8_ = lVar6;
    auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_0010c230;
    auVar14 = _DAT_0010c220;
    do {
      auVar17 = auVar14 ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar17._0_4_ ||
                  auVar12._4_4_ < auVar17._4_4_) & 1)) {
        x[uVar7] = (double)(int)uVar7 * 3000.0;
      }
      if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
          auVar17._12_4_ <= auVar12._12_4_) {
        x[uVar7 + 1] = (double)((int)uVar7 + 1) * 3000.0;
      }
      uVar7 = uVar7 + 2;
      lVar6 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar6 + 2;
    } while (((ulong)uVar8 + 1 & 0x1fffffffe) != uVar7);
  }
  x[(int)uVar8] = dVar13;
  y = (double *)operator_new__(uVar9);
  *y = -60.0;
  y[(int)uVar8] = -1e-12;
  if (0 < f0_length) {
    uVar9 = 0;
    do {
      if ((int)uVar3 < 1) {
        dVar18 = 0.0;
      }
      else {
        pdVar1 = coded_aperiodicity[uVar9];
        dVar18 = 0.0;
        uVar7 = 0;
        do {
          dVar18 = dVar18 + pdVar1[uVar7];
          y[uVar7 + 1] = pdVar1[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      if (dVar18 / (double)(int)uVar3 <= -0.5) {
        pdVar1 = aperiodicity[uVar9];
        interp1(x,y,uVar3 + 2,pdVar4,xi_length,pdVar1);
        if (-2 < fft_size) {
          uVar7 = 0;
          do {
            dVar18 = pow(10.0,pdVar1[uVar7] / 20.0);
            pdVar1[uVar7] = dVar18;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)f0_length);
  }
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(pdVar4);
  return;
}

Assistant:

void DecodeAperiodicity(const double * const *coded_aperiodicity,
    int f0_length, int fs, int fft_size, double **aperiodicity) {
  InitializeAperiodicity(f0_length, fft_size, aperiodicity);
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(fs) / fft_size * i;

  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;

  for (int i = 0; i < f0_length; ++i) {
    if (CheckVUV(coded_aperiodicity[i], number_of_aperiodicities,
      coarse_aperiodicity) == 1) continue;
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  delete[] coarse_aperiodicity;
  delete[] coarse_frequency_axis;
  delete[] frequency_axis;
}